

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_selectinrect(_glist *x,int lox,int loy,int hix,int hiy)

{
  int iVar1;
  int local_38;
  int local_34;
  int y2;
  int x2;
  int y1;
  int x1;
  t_gobj *y;
  int hiy_local;
  int hix_local;
  int loy_local;
  int lox_local;
  _glist *x_local;
  
  y._0_4_ = hiy;
  y._4_4_ = hix;
  hiy_local = loy;
  hix_local = lox;
  _loy_local = x;
  for (_y1 = x->gl_list; _y1 != (t_gobj *)0x0; _y1 = _y1->g_next) {
    gobj_getrect(_y1,_loy_local,&x2,&y2,&local_34,&local_38);
    if ((((x2 <= y._4_4_) && (hix_local <= local_34)) && (y2 <= (int)y)) && (hiy_local <= local_38))
    {
      iVar1 = glist_isselected(_loy_local,_y1);
      if (iVar1 == 0) {
        glist_select(_loy_local,_y1);
      }
    }
  }
  return;
}

Assistant:

void canvas_selectinrect(t_canvas *x, int lox, int loy, int hix, int hiy)
{
    t_gobj *y;
    for (y = x->gl_list; y; y = y->g_next)
    {
        int x1, y1, x2, y2;
        gobj_getrect(y, x, &x1, &y1, &x2, &y2);
        if (hix >= x1 && lox <= x2 && hiy >= y1 && loy <= y2
            && !glist_isselected(x, y))
                glist_select(x, y);
    }
}